

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O0

void polyscope::pick::setSelection(pair<polyscope::Structure_*,_unsigned_long> newPick)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (in_RDI == 0) {
    resetSelection();
  }
  else {
    haveSelectionVal = 1;
    currLocalPickInd = in_RSI;
    currPickStructure = in_RDI;
  }
  return;
}

Assistant:

void setSelection(std::pair<Structure*, size_t> newPick) {
  if (newPick.first == nullptr) {
    resetSelection();
  } else {
    haveSelectionVal = true;
    currPickStructure = newPick.first;
    currLocalPickInd = newPick.second;
  }
}